

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formdata.c
# Opt level: O2

int curl_formget(curl_httppost *form,void *arg,curl_formget_callback append)

{
  CURLcode CVar1;
  size_t sVar2;
  size_t sVar3;
  curl_mimepart toppart;
  char buffer [8192];
  
  Curl_mime_initpart(&toppart);
  CVar1 = Curl_getformdata((Curl_easy *)0x0,&toppart,form,(curl_read_callback)0x0);
  if (CVar1 == CURLE_OK) {
    CVar1 = Curl_mime_prepare_headers
                      ((Curl_easy *)0x0,&toppart,"multipart/form-data",(char *)0x0,MIMESTRATEGY_FORM
                      );
  }
LAB_0058ad5d:
  if (CVar1 == CURLE_OK) {
    sVar2 = Curl_mime_read(buffer,1,0x2000,&toppart);
    if (sVar2 != 0) {
      if (sVar2 < 0x2001) goto code_r0x0058ad84;
      goto LAB_0058ad97;
    }
  }
  Curl_mime_cleanpart(&toppart);
  return CVar1;
code_r0x0058ad84:
  sVar3 = (*append)(arg,buffer,sVar2);
  CVar1 = CURLE_OK;
  if (sVar3 != sVar2) {
LAB_0058ad97:
    CVar1 = (uint)(sVar2 == 0x10000000) * 0x10 + CURLE_READ_ERROR;
  }
  goto LAB_0058ad5d;
}

Assistant:

int curl_formget(struct curl_httppost *form, void *arg,
                 curl_formget_callback append)
{
  CURLcode result;
  curl_mimepart toppart;

  Curl_mime_initpart(&toppart); /* default form is empty */
  result = Curl_getformdata(NULL, &toppart, form, NULL);
  if(!result)
    result = Curl_mime_prepare_headers(NULL, &toppart, "multipart/form-data",
                                       NULL, MIMESTRATEGY_FORM);

  while(!result) {
    char buffer[8192];
    size_t nread = Curl_mime_read(buffer, 1, sizeof(buffer), &toppart);

    if(!nread)
      break;

    if(nread > sizeof(buffer) || append(arg, buffer, nread) != nread) {
      result = CURLE_READ_ERROR;
      if(nread == CURL_READFUNC_ABORT)
        result = CURLE_ABORTED_BY_CALLBACK;
    }
  }

  Curl_mime_cleanpart(&toppart);
  return (int) result;
}